

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

uint32_t ndn_signature_info_probe_block_size(ndn_signature_t *signature)

{
  ulong uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  
  if (signature->enable_KeyLocator == '\0') {
    uVar4 = 3;
  }
  else {
    uVar3 = ndn_name_probe_block_size(&signature->key_locator_name);
    iVar5 = (0xffff < uVar3) + 3 + (uint)(0xffff < uVar3);
    if (uVar3 < 0xfd) {
      iVar5 = 1;
    }
    uVar4 = uVar3 + iVar5 + 4;
  }
  uVar2 = uVar4 + 0x2a;
  if (signature->enable_ValidityPeriod == '\0') {
    uVar2 = uVar4;
  }
  uVar4 = uVar2 + 6;
  if (signature->enable_SignatureNonce == '\0') {
    uVar4 = uVar2;
  }
  if (signature->enable_Timestamp != '\0') {
    uVar1 = signature->timestamp;
    if (uVar1 < 0x100) {
      iVar5 = 3;
    }
    else if (uVar1 < 0x10000) {
      iVar5 = 4;
    }
    else {
      iVar5 = (uint)(uVar1 >> 0x20 != 0) * 4 + 6;
    }
    uVar4 = uVar4 + iVar5;
  }
  if (signature->enable_Seqnum != '\0') {
    uVar1 = signature->seqnum;
    if (uVar1 < 0x100) {
      iVar5 = 3;
    }
    else if (uVar1 < 0x10000) {
      iVar5 = 4;
    }
    else {
      iVar5 = (uint)(uVar1 >> 0x20 != 0) * 4 + 6;
    }
    uVar4 = uVar4 + iVar5;
  }
  iVar5 = (0xffff < uVar4) + 3 + (uint)(0xffff < uVar4);
  if (uVar4 < 0xfd) {
    iVar5 = 1;
  }
  return uVar4 + iVar5 + 1;
}

Assistant:

static inline uint32_t
ndn_signature_info_probe_block_size(const ndn_signature_t* signature)
{
  // signature type
  uint32_t info_buffer_size = encoder_probe_block_size(TLV_SignatureType, 1);

  if (signature->enable_KeyLocator > 0) {
    uint32_t key_name_block_size = ndn_name_probe_block_size(&signature->key_locator_name);
    info_buffer_size += encoder_probe_block_size(TLV_KeyLocator, key_name_block_size);
  }
  if (signature->enable_ValidityPeriod > 0) {
    uint32_t validity_period_buffer_size = encoder_probe_block_size(TLV_NotBefore, 15);
    validity_period_buffer_size += encoder_probe_block_size(TLV_NotAfter, 15);
    info_buffer_size += encoder_probe_block_size(TLV_ValidityPeriod, validity_period_buffer_size);
  }
  if (signature->enable_SignatureNonce > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SignatureNonce, 4);
  }
  if (signature->enable_Timestamp > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Timestamp,
                                                 encoder_probe_uint_length(signature->timestamp));
  }
  if (signature->enable_Seqnum > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SeqNum,
                                                 encoder_probe_uint_length(signature->seqnum));
  }
  if (signature->is_interest)
    return encoder_probe_block_size(TLV_InterestSignatureInfo, info_buffer_size);
  else
    return encoder_probe_block_size(TLV_SignatureInfo, info_buffer_size);
}